

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void write_parameter_file(char *fname)

{
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  int local_130;
  int local_12c;
  int k_15;
  int j_3;
  int i_17;
  int p2_3;
  int p1_3;
  int k_14;
  int j_2;
  int i_16;
  int p2_2;
  int p1_2;
  int j_1;
  int i_15;
  int p2_1;
  int p1_1;
  int j;
  int i_14;
  int p2;
  int p1;
  int l_1;
  int k_13;
  int i_13;
  int l;
  int k_12;
  int i_12;
  int k_11;
  int i_11;
  int k_10;
  int i_10;
  int k_9;
  int i_9;
  int k_8;
  int i_8;
  int k_7;
  int i_7;
  int k_6;
  int i_6;
  int k_5;
  int i_5;
  int k_4;
  int i_4;
  int k_3;
  int i_3;
  int k_2;
  int i_2;
  int k_1;
  int i_1;
  int k;
  int i;
  char bnames [6];
  char *pnames [8];
  int local_1c;
  int c;
  FILE *outfp;
  char *fname_local;
  
  memcpy(&stack0xffffffffffffff98,&PTR_anon_var_dwarf_589dd_00315ce0,0x40);
  stack0xffffffffffffff92 = 0x47434140;
  i._2_2_ = 0x55;
  __stream = fopen(fname,"w");
  if (__stream == (FILE *)0x0) {
    vrna_message_error("can\'t open file %s",fname);
    exit(1);
  }
  fprintf(__stream,"## RNAfold parameter file v2.0\n");
  pcVar1 = settype(S);
  fprintf(__stream,"\n# %s\n",pcVar1);
  fprintf(__stream,"/*  CG    GC    GU    UG    AU    UA    @  */\n");
  for (local_1c = 1; local_1c < 8; local_1c = local_1c + 1) {
    display_array(stack37[local_1c] + 1,7,7,(FILE *)__stream);
  }
  pcVar1 = settype(S_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  fprintf(__stream,"/*  CG    GC    GU    UG    AU    UA    @  */\n");
  for (local_1c = 1; local_1c < 8; local_1c = local_1c + 1) {
    display_array(stackdH[local_1c] + 1,7,7,(FILE *)__stream);
  }
  pcVar1 = settype(MMH);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (k_1 = 1; k_1 < 8; k_1 = k_1 + 1) {
    for (i_1 = 0; i_1 < 5; i_1 = i_1 + 1) {
      display_array(mismatchH37[k_1][i_1],5,5,(FILE *)__stream);
    }
  }
  pcVar1 = settype(MMH_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (k_2 = 1; k_2 < 8; k_2 = k_2 + 1) {
    for (i_2 = 0; i_2 < 5; i_2 = i_2 + 1) {
      display_array(mismatchHdH[k_2][i_2],5,5,(FILE *)__stream);
    }
  }
  pcVar1 = settype(MMI);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (k_3 = 1; k_3 < 8; k_3 = k_3 + 1) {
    for (i_3 = 0; i_3 < 5; i_3 = i_3 + 1) {
      display_array(mismatchI37[k_3][i_3],5,5,(FILE *)__stream);
    }
  }
  pcVar1 = settype(MMI_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (k_4 = 1; k_4 < 8; k_4 = k_4 + 1) {
    for (i_4 = 0; i_4 < 5; i_4 = i_4 + 1) {
      display_array(mismatchIdH[k_4][i_4],5,5,(FILE *)__stream);
    }
  }
  pcVar1 = settype(MMI1N);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (k_5 = 1; k_5 < 8; k_5 = k_5 + 1) {
    for (i_5 = 0; i_5 < 5; i_5 = i_5 + 1) {
      display_array(mismatch1nI37[k_5][i_5],5,5,(FILE *)__stream);
    }
  }
  pcVar1 = settype(MMI1N_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (k_6 = 1; k_6 < 8; k_6 = k_6 + 1) {
    for (i_6 = 0; i_6 < 5; i_6 = i_6 + 1) {
      display_array(mismatch1nIdH[k_6][i_6],5,5,(FILE *)__stream);
    }
  }
  pcVar1 = settype(MMI23);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (k_7 = 1; k_7 < 8; k_7 = k_7 + 1) {
    for (i_7 = 0; i_7 < 5; i_7 = i_7 + 1) {
      display_array(mismatch23I37[k_7][i_7],5,5,(FILE *)__stream);
    }
  }
  pcVar1 = settype(MMI23_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (k_8 = 1; k_8 < 8; k_8 = k_8 + 1) {
    for (i_8 = 0; i_8 < 5; i_8 = i_8 + 1) {
      display_array(mismatch23IdH[k_8][i_8],5,5,(FILE *)__stream);
    }
  }
  pcVar1 = settype(MMM);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (k_9 = 1; k_9 < 8; k_9 = k_9 + 1) {
    for (i_9 = 0; i_9 < 5; i_9 = i_9 + 1) {
      display_array(mismatchM37[k_9][i_9],5,5,(FILE *)__stream);
    }
  }
  pcVar1 = settype(MMM_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (k_10 = 1; k_10 < 8; k_10 = k_10 + 1) {
    for (i_10 = 0; i_10 < 5; i_10 = i_10 + 1) {
      display_array(mismatchMdH[k_10][i_10],5,5,(FILE *)__stream);
    }
  }
  pcVar1 = settype(MME);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (k_11 = 1; k_11 < 8; k_11 = k_11 + 1) {
    for (i_11 = 0; i_11 < 5; i_11 = i_11 + 1) {
      display_array(mismatchExt37[k_11][i_11],5,5,(FILE *)__stream);
    }
  }
  pcVar1 = settype(MME_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (k_12 = 1; k_12 < 8; k_12 = k_12 + 1) {
    for (i_12 = 0; i_12 < 5; i_12 = i_12 + 1) {
      display_array(mismatchExtdH[k_12][i_12],5,5,(FILE *)__stream);
    }
  }
  pcVar1 = settype(D5);
  fprintf(__stream,"\n# %s\n",pcVar1);
  fprintf(__stream,"/*  @     A     C     G     U   */\n");
  for (local_1c = 1; local_1c < 8; local_1c = local_1c + 1) {
    display_array(dangle5_37[local_1c],5,5,(FILE *)__stream);
  }
  pcVar1 = settype(D5_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  fprintf(__stream,"/*  @     A     C     G     U   */\n");
  for (local_1c = 1; local_1c < 8; local_1c = local_1c + 1) {
    display_array(dangle5_dH[local_1c],5,5,(FILE *)__stream);
  }
  pcVar1 = settype(D3);
  fprintf(__stream,"\n# %s\n",pcVar1);
  fprintf(__stream,"/*  @     A     C     G     U   */\n");
  for (local_1c = 1; local_1c < 8; local_1c = local_1c + 1) {
    display_array(dangle3_37[local_1c],5,5,(FILE *)__stream);
  }
  pcVar1 = settype(D3_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  fprintf(__stream,"/*  @     A     C     G     U   */\n");
  for (local_1c = 1; local_1c < 8; local_1c = local_1c + 1) {
    display_array(dangle3_dH[local_1c],5,5,(FILE *)__stream);
  }
  pcVar1 = settype(INT11);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (i_13 = 1; i_13 < 8; i_13 = i_13 + 1) {
    for (k_13 = 1; k_13 < 8; k_13 = k_13 + 1) {
      fprintf(__stream,"/* %2s..%2s */\n",*(undefined8 *)(&stack0xffffffffffffff98 + (long)i_13 * 8)
              ,*(undefined8 *)(&stack0xffffffffffffff98 + (long)k_13 * 8));
      for (l = 0; l < 5; l = l + 1) {
        display_array(int11_37[i_13][k_13][l],5,5,(FILE *)__stream);
      }
    }
  }
  pcVar1 = settype(INT11_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (p1 = 1; p1 < 8; p1 = p1 + 1) {
    for (p2 = 1; p2 < 8; p2 = p2 + 1) {
      fprintf(__stream,"/* %2s..%2s */\n",*(undefined8 *)(&stack0xffffffffffffff98 + (long)p1 * 8),
              *(undefined8 *)(&stack0xffffffffffffff98 + (long)p2 * 8));
      for (l_1 = 0; l_1 < 5; l_1 = l_1 + 1) {
        display_array(int11_dH[p1][p2][l_1],5,5,(FILE *)__stream);
      }
    }
  }
  pcVar1 = settype(INT21);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (i_14 = 1; i_14 < 8; i_14 = i_14 + 1) {
    for (j = 1; j < 8; j = j + 1) {
      for (p1_1 = 0; p1_1 < 5; p1_1 = p1_1 + 1) {
        fprintf(__stream,"/* %2s.%c..%2s */\n",
                *(undefined8 *)(&stack0xffffffffffffff98 + (long)i_14 * 8),
                (ulong)(uint)(int)*(char *)((long)&k + (long)p1_1 + 2),
                *(undefined8 *)(&stack0xffffffffffffff98 + (long)j * 8));
        for (p2_1 = 0; p2_1 < 5; p2_1 = p2_1 + 1) {
          display_array(int21_37[i_14][j][p1_1][p2_1],5,5,(FILE *)__stream);
        }
      }
    }
  }
  pcVar1 = settype(INT21_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (i_15 = 1; i_15 < 8; i_15 = i_15 + 1) {
    for (j_1 = 1; j_1 < 8; j_1 = j_1 + 1) {
      for (p1_2 = 0; p1_2 < 5; p1_2 = p1_2 + 1) {
        fprintf(__stream,"/* %2s.%c..%2s */\n",
                *(undefined8 *)(&stack0xffffffffffffff98 + (long)i_15 * 8),
                (ulong)(uint)(int)*(char *)((long)&k + (long)p1_2 + 2),
                *(undefined8 *)(&stack0xffffffffffffff98 + (long)j_1 * 8));
        for (p2_2 = 0; p2_2 < 5; p2_2 = p2_2 + 1) {
          display_array(int21_dH[i_15][j_1][p1_2][p2_2],5,5,(FILE *)__stream);
        }
      }
    }
  }
  pcVar1 = settype(INT22);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (i_16 = 1; i_16 < 7; i_16 = i_16 + 1) {
    for (j_2 = 1; j_2 < 7; j_2 = j_2 + 1) {
      for (k_14 = 1; k_14 < 5; k_14 = k_14 + 1) {
        for (p1_3 = 1; p1_3 < 5; p1_3 = p1_3 + 1) {
          fprintf(__stream,"/* %2s.%c%c..%2s */\n",
                  *(undefined8 *)(&stack0xffffffffffffff98 + (long)i_16 * 8),
                  (ulong)(uint)(int)*(char *)((long)&k + (long)k_14 + 2),
                  (ulong)(uint)(int)*(char *)((long)&k + (long)p1_3 + 2),
                  *(undefined8 *)(&stack0xffffffffffffff98 + (long)j_2 * 8));
          for (p2_3 = 1; p2_3 < 5; p2_3 = p2_3 + 1) {
            display_array(int22_37[i_16][j_2][k_14][p1_3][p2_3] + 1,4,5,(FILE *)__stream);
          }
        }
      }
    }
  }
  pcVar1 = settype(INT22_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  for (i_17 = 1; i_17 < 7; i_17 = i_17 + 1) {
    for (j_3 = 1; j_3 < 7; j_3 = j_3 + 1) {
      for (k_15 = 1; k_15 < 5; k_15 = k_15 + 1) {
        for (local_12c = 1; local_12c < 5; local_12c = local_12c + 1) {
          fprintf(__stream,"/* %2s.%c%c..%2s */\n",
                  *(undefined8 *)(&stack0xffffffffffffff98 + (long)i_17 * 8),
                  (ulong)(uint)(int)*(char *)((long)&k + (long)k_15 + 2),
                  (ulong)(uint)(int)*(char *)((long)&k + (long)local_12c + 2),
                  *(undefined8 *)(&stack0xffffffffffffff98 + (long)j_3 * 8));
          for (local_130 = 1; local_130 < 5; local_130 = local_130 + 1) {
            display_array(int22_dH[i_17][j_3][k_15][local_12c][local_130] + 1,4,5,(FILE *)__stream);
          }
        }
      }
    }
  }
  pcVar1 = settype(HP);
  fprintf(__stream,"\n# %s\n",pcVar1);
  display_array(hairpin37,0x1f,10,(FILE *)__stream);
  pcVar1 = settype(HP_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  display_array(hairpindH,0x1f,10,(FILE *)__stream);
  pcVar1 = settype(B);
  fprintf(__stream,"\n# %s\n",pcVar1);
  display_array(bulge37,0x1f,10,(FILE *)__stream);
  pcVar1 = settype(B_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  display_array(bulgedH,0x1f,10,(FILE *)__stream);
  pcVar1 = settype(IL);
  fprintf(__stream,"\n# %s\n",pcVar1);
  display_array(internal_loop37,0x1f,10,(FILE *)__stream);
  pcVar1 = settype(IL_H);
  fprintf(__stream,"\n# %s\n",pcVar1);
  display_array(internal_loopdH,0x1f,10,(FILE *)__stream);
  pcVar1 = settype(ML);
  fprintf(__stream,"\n# %s\n",pcVar1);
  fprintf(__stream,"/* F = cu*n_unpaired + cc + ci*loop_degree (+TermAU) */\n");
  fprintf(__stream,"/*\t    cu\t cu_dH\t    cc\t cc_dH\t    ci\t ci_dH  */\n");
  fprintf(__stream,"\t%6d\t%6d\t%6d\t%6d\t%6d\t%6d\n",(ulong)(uint)ML_BASE37,(ulong)(uint)ML_BASEdH,
          (ulong)(uint)ML_closing37,(ulong)(uint)ML_closingdH,ML_intern37,ML_interndH);
  pcVar1 = settype(NIN);
  fprintf(__stream,"\n# %s\n",pcVar1);
  fprintf(__stream,
          "/* Ninio = MIN(max, m*|n1-n2| */\n/*\t    m\t  m_dH     max  */\n\t%6d\t%6d\t%6d\n",
          (ulong)(uint)ninio37,(ulong)(uint)niniodH,(ulong)(uint)MAX_NINIO);
  pcVar1 = settype(MISC);
  fprintf(__stream,"\n# %s\n",pcVar1);
  fprintf(__stream,"/* all parameters are pairs of \'energy enthalpy\' */\n");
  fprintf(__stream,"/*    DuplexInit     TerminalAU      LXC */\n");
  fprintf(__stream,"   %6d %6d %6d  %6d %3.6f %6d\n",lxc37,(ulong)(uint)DuplexInit37,
          (ulong)(uint)DuplexInitdH,(ulong)(uint)TerminalAU37,(ulong)(uint)TerminalAUdH,0);
  pcVar1 = settype(HEX);
  fprintf(__stream,"\n# %s\n",pcVar1);
  local_1c = 0;
  while( true ) {
    sVar2 = strlen(Hexaloops);
    if (sVar2 / 9 <= (ulong)(long)local_1c) break;
    fprintf(__stream,"\t%.8s %6d %6d\n",Hexaloops + local_1c * 9,(ulong)(uint)Hexaloop37[local_1c],
            (ulong)(uint)HexaloopdH[local_1c]);
    local_1c = local_1c + 1;
  }
  pcVar1 = settype(TL);
  fprintf(__stream,"\n# %s\n",pcVar1);
  local_1c = 0;
  while( true ) {
    sVar2 = strlen(Tetraloops);
    if (sVar2 / 7 <= (ulong)(long)local_1c) break;
    fprintf(__stream,"\t%.6s %6d %6d\n",Tetraloops + local_1c * 7,(ulong)(uint)Tetraloop37[local_1c]
            ,(ulong)(uint)TetraloopdH[local_1c]);
    local_1c = local_1c + 1;
  }
  pcVar1 = settype(TRI);
  fprintf(__stream,"\n# %s\n",pcVar1);
  local_1c = 0;
  while( true ) {
    sVar2 = strlen(Triloops);
    if (sVar2 / 6 <= (ulong)(long)local_1c) break;
    fprintf(__stream,"\t%.5s %6d %6d\n",Triloops + local_1c * 6,(ulong)(uint)Triloop37[local_1c],
            (ulong)(uint)TriloopdH[local_1c]);
    local_1c = local_1c + 1;
  }
  pcVar1 = settype(QUIT);
  fprintf(__stream,"\n# %s\n",pcVar1);
  fclose(__stream);
  return;
}

Assistant:

PUBLIC void
write_parameter_file(const char fname[])
{
  FILE  *outfp;
  int   c;
  char  *pnames[] = {
    "NP", "CG", "GC", "GU", "UG", "AU", "UA", " @"
  };
  char  bnames[] = "@ACGU";

  outfp = fopen(fname, "w");
  if (!outfp) {
    vrna_message_error("can't open file %s", fname);
    exit(1);
  }

  fprintf(outfp, "## RNAfold parameter file v2.0\n");

  fprintf(outfp, "\n# %s\n", settype(S));
  fprintf(outfp, "/*  CG    GC    GU    UG    AU    UA    @  */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(stack37[c] + 1, NBPAIRS, NBPAIRS, outfp);

  fprintf(outfp, "\n# %s\n", settype(S_H));
  fprintf(outfp, "/*  CG    GC    GU    UG    AU    UA    @  */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(stackdH[c] + 1, NBPAIRS, NBPAIRS, outfp);

  fprintf(outfp, "\n# %s\n", settype(MMH));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchH37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMH_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchHdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchI37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchIdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI1N));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatch1nI37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI1N_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatch1nIdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI23));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatch23I37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI23_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatch23IdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMM));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchM37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMM_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchMdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MME));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchExt37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MME_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchExtdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(D5));
  fprintf(outfp, "/*  @     A     C     G     U   */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(dangle5_37[c], 5, 5, outfp);

  fprintf(outfp, "\n# %s\n", settype(D5_H));
  fprintf(outfp, "/*  @     A     C     G     U   */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(dangle5_dH[c], 5, 5, outfp);

  fprintf(outfp, "\n# %s\n", settype(D3));
  fprintf(outfp, "/*  @     A     C     G     U   */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(dangle3_37[c], 5, 5, outfp);

  fprintf(outfp, "\n# %s\n", settype(D3_H));
  fprintf(outfp, "/*  @     A     C     G     U   */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(dangle3_dH[c], 5, 5, outfp);


  /* dont print "no pair" entries for interior loop arrays */
  fprintf(outfp, "\n# %s\n", settype(INT11));
  {
    int i, k, l;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (l = 1; l < NBPAIRS + 1; l++) {
        fprintf(outfp, "/* %2s..%2s */\n", pnames[k], pnames[l]);
        for (i = 0; i < 5; i++)
          display_array(int11_37[k][l][i], 5, 5, outfp);
      }
  }

  fprintf(outfp, "\n# %s\n", settype(INT11_H));
  {
    int i, k, l;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (l = 1; l < NBPAIRS + 1; l++) {
        fprintf(outfp, "/* %2s..%2s */\n", pnames[k], pnames[l]);
        for (i = 0; i < 5; i++)
          display_array(int11_dH[k][l][i], 5, 5, outfp);
      }
  }

  fprintf(outfp, "\n# %s\n", settype(INT21));
  {
    int p1, p2, i, j;
    for (p1 = 1; p1 < NBPAIRS + 1; p1++)
      for (p2 = 1; p2 < NBPAIRS + 1; p2++)
        for (i = 0; i < 5; i++) {
          fprintf(outfp, "/* %2s.%c..%2s */\n",
                  pnames[p1], bnames[i], pnames[p2]);
          for (j = 0; j < 5; j++)
            display_array(int21_37[p1][p2][i][j], 5, 5, outfp);
        }
  }

  fprintf(outfp, "\n# %s\n", settype(INT21_H));
  {
    int p1, p2, i, j;
    for (p1 = 1; p1 < NBPAIRS + 1; p1++)
      for (p2 = 1; p2 < NBPAIRS + 1; p2++)
        for (i = 0; i < 5; i++) {
          fprintf(outfp, "/* %2s.%c..%2s */\n",
                  pnames[p1], bnames[i], pnames[p2]);
          for (j = 0; j < 5; j++)
            display_array(int21_dH[p1][p2][i][j], 5, 5, outfp);
        }
  }

  fprintf(outfp, "\n# %s\n", settype(INT22));
  {
    int p1, p2, i, j, k;
    for (p1 = 1; p1 < NBPAIRS; p1++)
      for (p2 = 1; p2 < NBPAIRS; p2++)
        for (i = 1; i < 5; i++)
          for (j = 1; j < 5; j++) {
            fprintf(outfp, "/* %2s.%c%c..%2s */\n",
                    pnames[p1], bnames[i], bnames[j], pnames[p2]);
            for (k = 1; k < 5; k++)
              display_array(int22_37[p1][p2][i][j][k] + 1, 4, 5, outfp);
          }
  }

  fprintf(outfp, "\n# %s\n", settype(INT22_H));
  {
    int p1, p2, i, j, k;
    for (p1 = 1; p1 < NBPAIRS; p1++)
      for (p2 = 1; p2 < NBPAIRS; p2++)
        for (i = 1; i < 5; i++)
          for (j = 1; j < 5; j++) {
            fprintf(outfp, "/* %2s.%c%c..%2s */\n",
                    pnames[p1], bnames[i], bnames[j], pnames[p2]);
            for (k = 1; k < 5; k++)
              display_array(int22_dH[p1][p2][i][j][k] + 1, 4, 5, outfp);
          }
  }

  fprintf(outfp, "\n# %s\n", settype(HP));
  display_array(hairpin37, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(HP_H));
  display_array(hairpindH, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(B));
  display_array(bulge37, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(B_H));
  display_array(bulgedH, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(IL));
  display_array(internal_loop37, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(IL_H));
  display_array(internal_loopdH, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(ML));
  fprintf(outfp, "/* F = cu*n_unpaired + cc + ci*loop_degree (+TermAU) */\n");
  fprintf(outfp, "/*\t    cu\t cu_dH\t    cc\t cc_dH\t    ci\t ci_dH  */\n");
  fprintf(outfp,
          "\t%6d\t%6d\t%6d\t%6d\t%6d\t%6d\n",
          ML_BASE37,
          ML_BASEdH,
          ML_closing37,
          ML_closingdH,
          ML_intern37,
          ML_interndH);

  fprintf(outfp, "\n# %s\n", settype(NIN));
  fprintf(outfp, "/* Ninio = MIN(max, m*|n1-n2| */\n"
          "/*\t    m\t  m_dH     max  */\n"
          "\t%6d\t%6d\t%6d\n", ninio37, niniodH, MAX_NINIO);

  fprintf(outfp, "\n# %s\n", settype(MISC));
  fprintf(outfp, "/* all parameters are pairs of 'energy enthalpy' */\n");
  fprintf(outfp, "/*    DuplexInit     TerminalAU      LXC */\n");
  fprintf(outfp,
          "   %6d %6d %6d  %6d %3.6f %6d\n",
          DuplexInit37,
          DuplexInitdH,
          TerminalAU37,
          TerminalAUdH,
          lxc37,
          0);

  fprintf(outfp, "\n# %s\n", settype(HEX));
  for (c = 0; c < strlen(Hexaloops) / 9; c++)
    fprintf(outfp, "\t%.8s %6d %6d\n", Hexaloops + c * 9, Hexaloop37[c], HexaloopdH[c]);

  fprintf(outfp, "\n# %s\n", settype(TL));
  for (c = 0; c < strlen(Tetraloops) / 7; c++)
    fprintf(outfp, "\t%.6s %6d %6d\n", Tetraloops + c * 7, Tetraloop37[c], TetraloopdH[c]);

  fprintf(outfp, "\n# %s\n", settype(TRI));
  for (c = 0; c < strlen(Triloops) / 6; c++)
    fprintf(outfp, "\t%.5s %6d %6d\n", Triloops + c * 6, Triloop37[c], TriloopdH[c]);

  fprintf(outfp, "\n# %s\n", settype(QUIT));
  fclose(outfp);
}